

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O0

iterator __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::FindMacroDefinition
          (ConversionStream *this,string *MacroName)

{
  bool bVar1;
  bool bVar2;
  Char *_Str;
  pointer ppVar3;
  pointer pHVar4;
  long lVar5;
  bool local_89;
  _Self local_68;
  _Self local_60;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> local_58;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> Token;
  HashMapStringKey local_38;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>,_false>
  local_28;
  iterator define_it;
  string *MacroName_local;
  ConversionStream *this_local;
  
  define_it.
  super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>,_false>
             )(_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>,_false>
               )MacroName;
  _Str = (Char *)std::__cxx11::string::c_str();
  HashMapStringKey::HashMapStringKey(&local_38,_Str,false);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>_>_>
       ::find(&this->m_PreprocessorDefinitions,&local_38);
  HashMapStringKey::~HashMapStringKey(&local_38);
  Token._M_node =
       (_List_node_base *)
       std::
       unordered_map<Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>_>_>
       ::end(&this->m_PreprocessorDefinitions);
  bVar1 = std::__detail::operator==
                    (&local_28,
                     (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>,_false>
                      *)&Token);
  if (bVar1) {
    this_local = (ConversionStream *)
                 std::__cxx11::
                 list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                 ::end(&this->m_Tokens);
  }
  else {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>,_false,_false>
                           *)&local_28);
    local_58._M_node = (ppVar3->second)._M_node;
    std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(&local_58);
    local_60._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
         end(&this->m_Tokens);
    bVar1 = std::operator==(&local_58,&local_60);
    local_89 = true;
    if (!bVar1) {
      pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_58);
      local_89 = std::operator!=(&pHVar4->Literal,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)define_it.
                                    super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>,_false>
                                    ._M_cur);
    }
    if (local_89 == false) {
      std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(&local_58);
      local_68._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
           ::end(&this->m_Tokens);
      bVar2 = std::operator==(&local_58,&local_68);
      bVar1 = true;
      if (!bVar2) {
        pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_58);
        lVar5 = std::__cxx11::string::find_first_of((char *)&pHVar4->Delimiter,0xc3b2d4);
        bVar1 = lVar5 != -1;
      }
      if (bVar1) {
        this_local = (ConversionStream *)
                     std::__cxx11::
                     list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                     ::end(&this->m_Tokens);
      }
      else {
        pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_58);
        bVar1 = Parsing::HLSLTokenInfo::IsBuiltInType(pHVar4);
        if ((bVar1) ||
           (pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_58),
           pHVar4->Type == Identifier)) {
          this_local = (ConversionStream *)local_58._M_node;
        }
        else {
          this_local = (ConversionStream *)
                       std::__cxx11::
                       list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                       ::end(&this->m_Tokens);
        }
      }
    }
    else {
      this_local = (ConversionStream *)
                   std::__cxx11::
                   list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                   ::end(&this->m_Tokens);
    }
  }
  return (iterator)(_List_node_base *)this_local;
}

Assistant:

HLSL2GLSLConverterImpl::TokenListType::iterator HLSL2GLSLConverterImpl::ConversionStream::FindMacroDefinition(const std::string& MacroName)
{
    auto define_it = m_PreprocessorDefinitions.find(MacroName.c_str());
    if (define_it == m_PreprocessorDefinitions.end())
        return m_Tokens.end();

    auto Token = define_it->second;
    // #define PS_OUTPUT PSOutput
    // ^

    ++Token;
    // #define PS_OUTPUT PSOutput
    //         ^
    if (Token == m_Tokens.end() || Token->Literal != MacroName)
        return m_Tokens.end();

    ++Token;
    // #define PS_OUTPUT PSOutput
    //                   ^

    // Check that the definition is on the same line (we don't handle multiline definitions)
    if (Token == m_Tokens.end() || Token->Delimiter.find_first_of("\r\n") != std::string::npos)
        return m_Tokens.end();

    return (Token->IsBuiltInType() || Token->Type == TokenType::Identifier) ? Token : m_Tokens.end();
}